

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp.cc
# Opt level: O3

void __thiscall
mp::SPAdapter::GetRealizations(SPAdapter *this,int con_index,CallExpr random,int *arg_index)

{
  pointer *ppRVar1;
  pointer this_00;
  pointer pRVar2;
  pointer pdVar3;
  pointer pdVar4;
  iterator __position;
  pointer piVar5;
  int *piVar6;
  iterator __position_00;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  Error *pEVar10;
  uint *puVar11;
  ulong uVar12;
  int iVar13;
  int var_index;
  string local_60;
  int local_3c;
  uint local_38;
  int local_34;
  
  pRVar2 = (this->rvs_).
           super__Vector_base<mp::SPAdapter::RandomVector,_std::allocator<mp::SPAdapter::RandomVector>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = pRVar2 + con_index;
  puVar11 = *(uint **)((long)random.super_BasicExpr<(mp::expr::Kind)41,_(mp::expr::Kind)41>.
                             super_ExprBase.impl_ + 0x18 + (long)*arg_index * 8);
  local_60._M_string_length._0_4_ = 0;
  if ((*puVar11 & 0xfffffffe) != 2) {
    puVar11 = (uint *)0x0;
  }
  uVar7 = puVar11[1];
  pdVar3 = *(pointer *)
            &pRVar2[con_index].probabilities_.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl;
  pdVar4 = *(pointer *)
            ((long)&pRVar2[con_index].probabilities_.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl + 8);
  if (pdVar3 != pdVar4) {
    local_60._M_string_length._0_4_ =
         (int)((ulong)((long)(this_00->data_).super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this_00->data_).super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3) /
              (ulong)((long)pdVar4 - (long)pdVar3 >> 3));
  }
  local_60._M_dataplus._M_p._4_4_ = con_index;
  local_60._M_dataplus._M_p._0_4_ = uVar7;
  __position._M_current =
       (this->random_vars_).
       super__Vector_base<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = uVar7;
  if (__position._M_current ==
      (this->random_vars_).
      super__Vector_base<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>::
    _M_realloc_insert<mp::SPAdapter::RandomVarInfo>
              (&this->random_vars_,__position,(RandomVarInfo *)&local_60);
  }
  else {
    (__position._M_current)->element_index = (int)local_60._M_string_length;
    *(pointer *)__position._M_current = local_60._M_dataplus._M_p;
    ppRVar1 = &(this->random_vars_).
               super__Vector_base<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppRVar1 = *ppRVar1 + 1;
  }
  piVar5 = (this->var_orig2core_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar5[(int)uVar7] != 0) {
    pEVar10 = (Error *)__cxa_allocate_exception(0x18);
    local_34 = con_index + 1;
    fmt::format<int>(&local_60,(CStringRef)0x175b98,&local_34);
    Error::Error<std::__cxx11::string,int>(pEVar10,(CStringRef)0x175b03,&local_60,(int *)&local_38);
    __cxa_throw(pEVar10,&Error::typeinfo,fmt::SystemError::~SystemError);
  }
  piVar5[(int)uVar7] =
       (int)((ulong)((long)(this->random_vars_).
                           super__Vector_base<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->random_vars_).
                          super__Vector_base<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 2) * 0x55555555;
  uVar12 = (long)*arg_index + 1;
  uVar7 = (uint)uVar12;
  *arg_index = uVar7;
  local_3c = con_index;
  if ((int)uVar7 <
      *(int *)((long)random.super_BasicExpr<(mp::expr::Kind)41,_(mp::expr::Kind)41>.super_ExprBase.
                     impl_ + 0x10)) {
    uVar9 = uVar12 & 0xffffffff;
    do {
      uVar7 = (uint)uVar9;
      piVar6 = *(int **)((long)random.super_BasicExpr<(mp::expr::Kind)41,_(mp::expr::Kind)41>.
                               super_ExprBase.impl_ + 0x18 + (long)(int)uVar7 * 8);
      if (*piVar6 != 1) break;
      local_60._M_dataplus._M_p = *(pointer *)(piVar6 + 2);
      __position_00._M_current =
           (this_00->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (this_00->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&this_00->data_,__position_00,
                   (double *)&local_60);
        uVar7 = *arg_index;
      }
      else {
        *__position_00._M_current = (double)local_60._M_dataplus._M_p;
        (this_00->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = __position_00._M_current + 1;
      }
      uVar7 = uVar7 + 1;
      uVar9 = (ulong)uVar7;
      *arg_index = uVar7;
    } while ((int)uVar7 <
             *(int *)((long)random.super_BasicExpr<(mp::expr::Kind)41,_(mp::expr::Kind)41>.
                            super_ExprBase.impl_ + 0x10));
  }
  iVar8 = (int)((ulong)((long)(this_00->probabilities_).
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(this_00->probabilities_).
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3);
  iVar13 = (int)((long)(int)uVar7 - uVar12);
  if (iVar8 == 0) {
    local_60._M_dataplus._M_p = (pointer)(1.0 / (double)iVar13);
    std::vector<double,_std::allocator<double>_>::resize
              (&this_00->probabilities_,(long)(int)uVar7 - uVar12,(value_type_conflict4 *)&local_60)
    ;
  }
  else if (iVar13 != iVar8) {
    pEVar10 = (Error *)__cxa_allocate_exception(0x18);
    local_34 = local_3c + 1;
    fmt::format<int>(&local_60,(CStringRef)0x175b98,&local_34);
    Error::Error<std::__cxx11::string>(pEVar10,(CStringRef)0x175b33,&local_60);
    __cxa_throw(pEVar10,&Error::typeinfo,fmt::SystemError::~SystemError);
  }
  return;
}

Assistant:

void SPAdapter::GetRealizations(int con_index, CallExpr random,
                                int &arg_index) {
  // Add a random variable.
  auto &rv = rvs_[con_index];
  auto var = Cast<Reference>(random.arg(arg_index));
  int var_index = var.index();
  random_vars_.push_back(RandomVarInfo(
                           var_index, con_index, rv.num_elements()));
  int &core_var_index = var_orig2core_[var_index];
  if (core_var_index != 0) {
    throw Error("{}: variable {} used in multiple random vectors",
                lcon_name(con_index), var_index);
  }
  // Mark variable as random.
  core_var_index = -static_cast<int>(random_vars_.size());

  // Get realizatons.
  int start_arg_index = ++arg_index;
  for (; ; ++arg_index) {
    if (arg_index >= random.num_args()) break;
    auto constant = Cast<NumericConstant>(random.arg(arg_index));
    if (!constant) break;
    rv.Add(constant.value());
  }
  int num_realizations = arg_index - start_arg_index;
  if (rv.num_realizations() == 0) {
    rv.set_num_realizations(num_realizations);
  } else if (rv.num_realizations() != num_realizations) {
    throw Error("{}: inconsistent number of realizations",
                lcon_name(con_index));
  }
}